

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O1

EncodingResult<kj::Array<wchar_t>_> *
kj::encodeWideString
          (EncodingResult<kj::Array<wchar_t>_> *__return_storage_ptr__,ArrayPtr<const_char> text,
          bool nulTerminate)

{
  undefined7 in_register_00000009;
  bool in_R8B;
  ArrayPtr<const_char> text_00;
  EncodingResult<kj::Array<char32_t>_> local_38;
  
  text_00.size_._1_7_ = in_register_00000009;
  text_00.size_._0_1_ = nulTerminate;
  text_00.ptr = (char *)text.size_;
  encodeUtf32(&local_38,(kj *)text.ptr,text_00,in_R8B);
  *(undefined4 *)&(__return_storage_ptr__->super_Array<wchar_t>).ptr =
       local_38.super_Array<char32_t>.ptr._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->super_Array<wchar_t>).ptr + 4) =
       local_38.super_Array<char32_t>.ptr._4_4_;
  *(undefined4 *)&(__return_storage_ptr__->super_Array<wchar_t>).size_ =
       (undefined4)local_38.super_Array<char32_t>.size_;
  *(undefined4 *)((long)&(__return_storage_ptr__->super_Array<wchar_t>).size_ + 4) =
       local_38.super_Array<char32_t>.size_._4_4_;
  (__return_storage_ptr__->super_Array<wchar_t>).disposer = local_38.super_Array<char32_t>.disposer;
  __return_storage_ptr__->hadErrors = local_38.hadErrors;
  return __return_storage_ptr__;
}

Assistant:

EncodingResult<Array<wchar_t>> encodeWideString(ArrayPtr<const char> text, bool nulTerminate) {
  return coerceTo<wchar_t>(WideConverter<sizeof(wchar_t)>::encode(text, nulTerminate));
}